

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void restore_tiles(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  tile_t *ptVar4;
  char cVar5;
  long lVar6;
  tilerow_t *ptVar7;
  vischar_t *vischar;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  byte *pbVar11;
  tilerow_t *ptVar12;
  byte bVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t left_skip;
  uint8_t clipped_height;
  uint8_t top_skip;
  uint8_t clipped_width;
  uint8_t local_52;
  char local_51;
  uint8_t local_50;
  byte local_4f;
  uint8_t local_4e;
  uint8_t local_4d;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  vischar = state->vischars;
  state->IY = vischar;
  cVar8 = '\b';
  do {
    if (vischar->flags != 0xff) {
      uVar14 = (uint8_t)((vischar->isopos).y >> 3);
      (state->isopos).y = uVar14;
      uVar15 = (uint8_t)((vischar->isopos).x >> 3);
      (state->isopos).x = uVar15;
      iVar3 = vischar_visible(state,vischar,&local_52,&local_4d,&local_4e,&local_4f);
      if (iVar3 == 0) {
        bVar1 = (local_4f >> 3) + 2;
        bVar13 = uVar14 - (state->map_position).y;
        cVar5 = bVar13 + bVar1;
        if (((cVar5 < '\0') || (cVar5 = cVar5 - (char)state->rows, cVar5 < '\x01')) ||
           (bVar1 = bVar1 - cVar5, '\0' < (char)bVar1)) {
          uVar9 = (uint)bVar1;
          if (4 < bVar1) {
            uVar9 = 5;
          }
          if (local_52 == '\0') {
            bVar1 = uVar15 - (state->map_position).x;
          }
          else {
            bVar1 = 0;
          }
          cVar5 = (char)state->columns;
          bVar2 = cVar5 - local_4d;
          local_40 = (ulong)(byte)(cVar5 * '\a' + bVar2);
          uVar10 = (ulong)bVar13;
          if (local_4e != '\0') {
            uVar10 = 0;
          }
          ptVar12 = state->window_buf + (ulong)bVar1 + state->window_buf_stride * uVar10;
          pbVar11 = state->tile_buf + (int)(state->columns * (int)uVar10 + (uint)bVar1);
          local_38 = (ulong)bVar2;
          local_50 = local_4d;
          local_51 = cVar8;
          do {
            local_48 = uVar9;
            local_4c = (uint)uVar10;
            local_44 = local_4c & 0xff;
            uVar14 = local_50;
            do {
              bVar13 = *pbVar11;
              ptVar4 = select_tile_set(state,bVar1,(uint8_t)local_44);
              lVar6 = 0;
              ptVar7 = ptVar12;
              do {
                *ptVar7 = ptVar4[bVar13].row[lVar6];
                ptVar7 = ptVar7 + state->columns;
                lVar6 = lVar6 + 1;
              } while ((char)lVar6 != '\b');
              bVar1 = bVar1 + 1;
              pbVar11 = pbVar11 + 1;
              ptVar12 = ptVar12 + 1;
              uVar14 = uVar14 + 0xff;
            } while (uVar14 != '\0');
            bVar1 = bVar1 - local_50;
            uVar10 = (ulong)CONCAT31((int3)(local_4c >> 8),(char)local_4c + '\x01');
            pbVar11 = pbVar11 + local_38;
            ptVar12 = ptVar12 + local_40;
            cVar8 = (char)local_48 + -1;
            uVar9 = CONCAT31((int3)(local_48 >> 8),cVar8);
          } while (cVar8 != '\0');
          vischar = state->IY;
          cVar8 = local_51;
        }
      }
    }
    vischar = vischar + 1;
    state->IY = vischar;
    cVar8 = cVar8 + -1;
  } while (cVar8 != '\0');
  return;
}

Assistant:

void restore_tiles(tgestate_t *state)
{
  uint8_t            iters;                         /* was B */
  const vischar_t   *vischar;                       /* new local copy */
  uint8_t            height;                        /* was A/$BC5F */
  int8_t             bottom;                        /* was A */
  uint8_t            width;                         /* was $BC61 */
  uint8_t            tilebuf_skip;                  /* was $BC8E */
  uint8_t            windowbuf_skip;                /* was $BC95 */
  uint8_t            width_counter, height_counter; /* was B,C */
  uint8_t            left_skip;                     /* was B */
  uint8_t            clipped_width;                 /* was C */
  uint8_t            top_skip;                      /* was D */
  uint8_t            clipped_height;                /* was E */
  const pos8_t      *map_position;                  /* was HL */
  uint8_t           *windowbuf;                     /* was HL */
  uint8_t           *windowbuf2;                    /* was DE */
  uint8_t            x, y;                          /* was H', L' */
  const tileindex_t *tilebuf;                       /* was HL/DE */
  tileindex_t        tile;                          /* was A */
  const tile_t      *tileset;                       /* was BC */
  uint8_t            tile_counter;                  /* was B' */
  const tilerow_t   *tilerow;                       /* was HL' */

  assert(state != NULL);

  iters     = vischars_LENGTH;
  state->IY = &state->vischars[0];
  do
  {
    vischar = state->IY; /* Conv: Added local copy of IY. */

    if (vischar->flags == vischar_FLAGS_EMPTY_SLOT)
      goto next;

    /* Get the visible character's position in screen space. */
    state->isopos.y = vischar->isopos.y >> 3; /* divide by 8 (16-to-8) */
    state->isopos.x = vischar->isopos.x >> 3; /* divide by 8 (16-to-8) */

    if (vischar_visible(state,
                        vischar,
                       &left_skip,
                       &clipped_width,
                       &top_skip,
                       &clipped_height))
      goto next; /* not visible */

    /* Compute scaled clipped height. */
    /* Conv: Rotate and mask turned into right shift. */
    height = (clipped_height >> 3) + 2; /* TODO: Explain the +2 fudge factor. */

    /* Note: It seems that the following sequence (from here to clamp_height)
     * duplicates the work done by vischar_visible. I can't see any benefit to
     * it. */

    /* Compute bottom = height + isopos_y - map_position_y. This is the
     * distance of the (clipped) bottom edge of the vischar from the top of the
     * window. */
    bottom = height + state->isopos.y - state->map_position.y;
    if (bottom >= 0)
    {
      /* Bottom edge is on-screen, or off the bottom of the screen. */

      bottom -= state->rows; /* i.e. 17 */
      if (bottom > 0)
      {
        /* Bottom edge is now definitely visible. */

        int8_t visible_height; /* was A */

        visible_height = height - bottom;
        if (visible_height < 0)
        {
          goto next; /* not visible */
        }
        else if (visible_height != 0)
        {
          height = visible_height;
          goto clamp_height;
        }
        else
        {
          /* Note: Could merge this case into the earlier one. */
          assert(visible_height == 0);
          goto next; /* not visible */
        }
      }
    }

clamp_height:
    /* Clamp the height to a maximum of five. */
    if (height > 5)
      height = 5;

    /* Conv: Self modifying code replaced. */

    width          = clipped_width;
    tilebuf_skip   = state->columns - width;
    windowbuf_skip = tilebuf_skip + 7 * state->columns;

    map_position   = &state->map_position;

    /* Work out x,y offsets into the tile buffer. */

    if (left_skip == 0)
      x = state->isopos.x - map_position->x;
    else
      x = 0; /* was interleaved */

    if (top_skip == 0)
      y = state->isopos.y - map_position->y;
    else
      y = 0; /* was interleaved */

    /* Calculate the offset into the window buffer. */

    windowbuf = &state->window_buf[y * state->window_buf_stride + x];
    ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);

    /* Calculate the offset into the tile buffer. */

    tilebuf = &state->tile_buf[x + y * state->columns];
    ASSERT_TILE_BUF_PTR_VALID(tilebuf);

    height_counter = height; /* in rows */
    do
    {
      width_counter = width; /* in columns */
      do
      {
        ASSERT_TILE_BUF_PTR_VALID(tilebuf);

        tile = *tilebuf;
        windowbuf2 = windowbuf;

        tileset = select_tile_set(state, x, y);

        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf2, 0);
        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf2 + 7 * state->columns, 0);

        /* Copy the tile into the window buffer. */
        tilerow = &tileset[tile].row[0];
        tile_counter = 8;
        do
        {
          *windowbuf2 = *tilerow++;
          windowbuf2 += state->columns;
        }
        while (--tile_counter);

        /* Move to next column. */
        x++;
        tilebuf++;
        if (width_counter > 1)
          ASSERT_TILE_BUF_PTR_VALID(tilebuf);
        windowbuf++;
        if (width_counter > 1)
          ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);
      }
      while (--width_counter);

      /* Reset x offset. Advance to next row. */
      x -= width;
      y++;
      tilebuf   += tilebuf_skip;
      if (height_counter > 1)
        ASSERT_TILE_BUF_PTR_VALID(tilebuf);
      windowbuf += windowbuf_skip;
      if (height_counter > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);
    }
    while (--height_counter);

next:
    state->IY++;
  }
  while (--iters);
}